

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O3

dgEdge * __thiscall
dgPolyhedra::TriangulateFace
          (dgPolyhedra *this,dgEdge *face,HaF64 *pool,HaI32 stride,
          dgDownHeap<dgEdge_*,_double> *heap,dgBigVector *faceNormalOut)

{
  HaI32 HVar1;
  HaI32 HVar2;
  dgEdge *pdVar3;
  dgEdge *pdVar4;
  undefined1 auVar5 [32];
  double dVar6;
  double dVar7;
  ulong uVar8;
  int iVar9;
  dgEdge *pdVar10;
  dgEdge *pdVar11;
  dgEdge *pdVar12;
  bool bVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  double dVar18;
  undefined1 auVar19 [32];
  undefined1 local_58 [16];
  double local_48;
  double dStack_40;
  
  iVar9 = 0x3fff;
  pdVar10 = face;
  do {
    bVar13 = iVar9 == 0;
    iVar9 = iVar9 + -1;
    if (bVar13) {
      __assert_fail("perimeterCount < hacd::HaI32 (sizeof (perimeter) / sizeof (perimeter[0]))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                    ,0xbe6,
                    "dgEdge *dgPolyhedra::TriangulateFace(dgEdge *, const hacd::HaF64 *const, hacd::HaI32, dgDownHeap<dgEdge *, hacd::HaF64> &, dgBigVector *const)"
                   );
    }
    pdVar10 = pdVar10->m_next;
  } while (pdVar10 != face);
  if (iVar9 == 0) {
    __assert_fail("(perimeterCount + 1) < hacd::HaI32 (sizeof (perimeter) / sizeof (perimeter[0]))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                  ,0xbea,
                  "dgEdge *dgPolyhedra::TriangulateFace(dgEdge *, const hacd::HaF64 *const, hacd::HaI32, dgDownHeap<dgEdge *, hacd::HaF64> &, dgBigVector *const)"
                 );
  }
  FaceNormal((dgBigVector *)local_58,(dgPolyhedra *)face,face,pool,stride * 8);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_48;
  dVar6 = local_58._0_8_;
  auVar15._0_8_ = dVar6 * dVar6;
  dVar7 = local_58._8_8_;
  auVar15._8_8_ = dVar7 * dVar7;
  auVar15 = vshufpd_avx(auVar15,auVar15,1);
  auVar15 = vfmadd231sd_fma(auVar15,local_58,local_58);
  auVar15 = vfmadd231sd_fma(auVar15,auVar16,auVar16);
  if (9.999999960041972e-13 <= auVar15._0_8_) {
    auVar15 = vsqrtsd_avx(auVar15,auVar15);
    dVar18 = 1.0 / auVar15._0_8_;
    local_58._0_8_ = dVar6 * dVar18;
    local_58._8_8_ = dVar7 * dVar18;
    local_48 = local_48 * dVar18;
    auVar17._8_8_ = dStack_40;
    auVar17._0_8_ = dStack_40;
    auVar17._16_8_ = dStack_40;
    auVar17._24_8_ = dStack_40;
    auVar19._8_8_ = local_48;
    auVar19._0_8_ = local_48;
    auVar19._16_8_ = local_48;
    auVar19._24_8_ = local_48;
    auVar5 = vblendpd_avx(ZEXT1632(local_58),auVar19,4);
    auVar5 = vblendpd_avx(auVar5,auVar17,8);
    auVar14._8_8_ = 0x7fffffffffffffff;
    auVar14._0_8_ = 0x7fffffffffffffff;
    auVar14._16_8_ = 0x7fffffffffffffff;
    auVar14._24_8_ = 0x7fffffffffffffff;
    auVar14 = vandpd_avx512vl(auVar5,auVar14);
    auVar5._8_8_ = 0x7fefffffffffffff;
    auVar5._0_8_ = 0x7fefffffffffffff;
    auVar5._16_8_ = 0x7fefffffffffffff;
    auVar5._24_8_ = 0x7fefffffffffffff;
    uVar8 = vpcmpgtq_avx512vl(auVar14,auVar5);
    if ((uVar8 & 0xf) != 0) {
      __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                    ,0x145,"dgBigVector::dgBigVector(const dgTemplateVector<hacd::HaF64> &)");
    }
    if (faceNormalOut != (dgBigVector *)0x0) {
      (faceNormalOut->super_dgTemplateVector<double>).m_x = local_58._0_8_;
      (faceNormalOut->super_dgTemplateVector<double>).m_y = local_58._8_8_;
      (faceNormalOut->super_dgTemplateVector<double>).m_z = local_48;
      (faceNormalOut->super_dgTemplateVector<double>).m_w = dStack_40;
    }
    while (face->m_next->m_next->m_next != face) {
      pdVar10 = FindEarTip(this,face,pool,stride,heap,(dgBigVector *)local_58);
      if (pdVar10 == (dgEdge *)0x0) {
        return face;
      }
      pdVar11 = pdVar10->m_prev;
      if (face == pdVar11 || face == pdVar10) {
        face = pdVar11->m_prev;
      }
      pdVar11 = AddHalfEdge(this,pdVar10->m_next->m_incidentVertex,pdVar11->m_incidentVertex);
      if (pdVar11 == (dgEdge *)0x0) {
        return face;
      }
      pdVar12 = AddHalfEdge(this,pdVar10->m_prev->m_incidentVertex,pdVar10->m_next->m_incidentVertex
                           );
      if (pdVar12 == (dgEdge *)0x0) {
        return face;
      }
      HVar1 = pdVar10->m_mark;
      pdVar11->m_mark = HVar1;
      pdVar3 = pdVar10->m_next;
      pdVar11->m_userData = pdVar3->m_userData;
      HVar2 = pdVar10->m_incidentFace;
      pdVar11->m_incidentFace = HVar2;
      pdVar12->m_mark = HVar1;
      pdVar4 = pdVar10->m_prev;
      pdVar12->m_userData = pdVar4->m_userData;
      pdVar12->m_incidentFace = HVar2;
      pdVar11->m_twin = pdVar12;
      pdVar12->m_twin = pdVar11;
      pdVar12->m_prev = pdVar4->m_prev;
      pdVar12->m_next = pdVar3;
      pdVar10->m_prev->m_prev->m_next = pdVar12;
      pdVar10->m_next->m_prev = pdVar12;
      pdVar11->m_next = pdVar10->m_prev;
      pdVar11->m_prev = pdVar10;
      pdVar10->m_prev->m_prev = pdVar11;
      pdVar10->m_next = pdVar11;
      (heap->super_dgHeapBase<dgEdge_*,_double>).m_curCount = 0;
    }
    face = (dgEdge *)0x0;
  }
  else if (faceNormalOut != (dgBigVector *)0x0) {
    (faceNormalOut->super_dgTemplateVector<double>).m_x = 0.0;
    (faceNormalOut->super_dgTemplateVector<double>).m_y = 0.0;
    (faceNormalOut->super_dgTemplateVector<double>).m_z = 0.0;
    (faceNormalOut->super_dgTemplateVector<double>).m_w = 0.0;
  }
  return face;
}

Assistant:

dgEdge* dgPolyhedra::TriangulateFace (dgEdge* face, const hacd::HaF64* const pool, hacd::HaI32 stride, dgDownHeap<dgEdge*, hacd::HaF64>& heap, dgBigVector* const faceNormalOut)
{
	dgEdge* perimeter [1024 * 16]; 
	dgEdge* ptr = face;
	hacd::HaI32 perimeterCount = 0;
	do {
		perimeter[perimeterCount] = ptr;
		perimeterCount ++;
		HACD_ASSERT (perimeterCount < hacd::HaI32 (sizeof (perimeter) / sizeof (perimeter[0])));
		ptr = ptr->m_next;
	} while (ptr != face);
	perimeter[perimeterCount] = face;
	HACD_ASSERT ((perimeterCount + 1) < hacd::HaI32 (sizeof (perimeter) / sizeof (perimeter[0])));

	dgBigVector normal (FaceNormal (face, pool, hacd::HaI32 (stride * sizeof (hacd::HaF64))));

	hacd::HaF64 dot = normal % normal;
	if (dot < hacd::HaF64 (1.0e-12f)) {
		if (faceNormalOut) {
			*faceNormalOut = dgBigVector (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f)); 
		}
		return face;
	}
	normal = normal.Scale (hacd::HaF64 (1.0f) / sqrt (dot));
	if (faceNormalOut) {
		*faceNormalOut = normal;
	}


	while (face->m_next->m_next->m_next != face) {
		dgEdge* const ear = FindEarTip (face, pool, stride, heap, normal); 
		if (!ear) {
			return face;
		}
		if ((face == ear)	|| (face == ear->m_prev)) {
			face = ear->m_prev->m_prev;
		}
		dgEdge* const edge = AddHalfEdge (ear->m_next->m_incidentVertex, ear->m_prev->m_incidentVertex);
		if (!edge) {
			return face;
		}
		dgEdge* const twin = AddHalfEdge (ear->m_prev->m_incidentVertex, ear->m_next->m_incidentVertex);
		if (!twin) {
			return face;
		}
		HACD_ASSERT (twin);


		edge->m_mark = ear->m_mark;
		edge->m_userData = ear->m_next->m_userData;
		edge->m_incidentFace = ear->m_incidentFace;

		twin->m_mark = ear->m_mark;
		twin->m_userData = ear->m_prev->m_userData;
		twin->m_incidentFace = ear->m_incidentFace;

		edge->m_twin = twin;
		twin->m_twin = edge;

		twin->m_prev = ear->m_prev->m_prev;
		twin->m_next = ear->m_next;
		ear->m_prev->m_prev->m_next = twin;
		ear->m_next->m_prev = twin;

		edge->m_next = ear->m_prev;
		edge->m_prev = ear;
		ear->m_prev->m_prev = edge;
		ear->m_next = edge;

		heap.Flush ();
	}
	return NULL;
}